

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

char * nk_dtoa(char *s,double n)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  if (s == (char *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0xf58,"char *nk_dtoa(char *, double)");
  }
  if ((n != 0.0) || (NAN(n))) {
    dVar16 = -n;
    if (-n <= n) {
      dVar16 = n;
    }
    dVar15 = -dVar16;
    if (-dVar16 <= dVar16) {
      dVar15 = dVar16;
    }
    uVar3 = 0;
    if (9 < (int)dVar15) {
      uVar3 = 0;
      uVar6 = (int)dVar15;
      do {
        uVar3 = uVar3 + 1;
        bVar14 = 99 < uVar6;
        uVar6 = uVar6 / 10;
      } while (bVar14);
    }
    uVar6 = -uVar3;
    if (0.0 <= dVar16) {
      uVar6 = uVar3;
    }
    bVar14 = 0xffffffe9 < uVar6 - 0xe;
    pbVar4 = (byte *)s;
    if (n < 0.0) {
      pbVar4 = (byte *)(s + 1);
      *s = '-';
    }
    if (bVar14 && ((int)uVar6 < 9 || 0.0 <= n)) {
      uVar3 = 0;
      uVar12 = uVar6;
      if ((int)uVar6 < 1) {
        uVar12 = uVar3;
      }
    }
    else {
      uVar3 = ((int)uVar6 >> 0x1f) + uVar6;
      uVar12 = -uVar3;
      if (0 < (int)uVar3) {
        uVar12 = uVar3;
      }
      dVar15 = 1.0;
      dVar17 = 10.0;
      do {
        if ((uVar12 & 1) != 0) {
          dVar15 = dVar15 * dVar17;
        }
        dVar17 = dVar17 * dVar17;
        bVar2 = 1 < uVar12;
        uVar12 = uVar12 >> 1;
      } while (bVar2);
      if ((int)uVar3 < 0) {
        dVar15 = 1.0 / dVar15;
      }
      dVar16 = dVar16 / dVar15;
      uVar12 = 0;
    }
    do {
      uVar11 = uVar12;
      dVar15 = 1.0;
      if (uVar11 != 0) {
        uVar12 = -uVar11;
        if (0 < (int)uVar11) {
          uVar12 = uVar11;
        }
        dVar17 = 10.0;
        dVar15 = 1.0;
        do {
          if ((uVar12 & 1) != 0) {
            dVar15 = dVar15 * dVar17;
          }
          dVar17 = dVar17 * dVar17;
          bVar2 = 1 < uVar12;
          uVar12 = uVar12 >> 1;
        } while (bVar2);
      }
      if ((int)uVar11 < 0) {
        dVar15 = 1.0 / dVar15;
      }
      if (0.0 < dVar15) {
        iVar13 = (int)(dVar16 / dVar15) - (uint)(dVar16 / dVar15 < 0.0);
        dVar16 = dVar16 - (double)iVar13 * dVar15;
        *pbVar4 = (char)iVar13 + 0x30;
        pbVar4 = pbVar4 + 1;
      }
      if ((uVar11 == 0) && (0.0 < dVar16)) {
        *pbVar4 = 0x2e;
        pbVar4 = pbVar4 + 1;
      }
      uVar12 = uVar11 - 1;
    } while ((1e-14 < dVar16) || (0 < (int)uVar11));
    pbVar8 = pbVar4;
    if (!bVar14 || (int)uVar6 >= 9 && 0.0 > n) {
      *pbVar4 = 0x65;
      if ((int)uVar3 < 1) {
        pbVar4[1] = 0x2d;
        pbVar8 = pbVar4 + 2;
        if (uVar3 == 0) goto LAB_0013ebc4;
        uVar3 = -uVar3;
      }
      else {
        pbVar4[1] = 0x2b;
      }
      pbVar5 = pbVar4 + 2;
      lVar9 = 2;
      pbVar8 = pbVar5;
      do {
        *pbVar8 = (char)uVar3 + (char)(uVar3 / 10) * -10 | 0x30;
        pbVar8 = pbVar8 + 1;
        lVar9 = lVar9 + -1;
        bVar14 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar14);
      if ((int)lVar9 != 1) {
        lVar7 = 0;
        lVar9 = -lVar9;
        do {
          bVar10 = pbVar5[lVar7];
          bVar1 = pbVar4[lVar9 + 3];
          pbVar5[lVar7] = bVar10 ^ bVar1;
          bVar10 = bVar10 ^ bVar1 ^ pbVar4[lVar9 + 3];
          pbVar4[lVar9 + 3] = bVar10;
          pbVar5[lVar7] = pbVar5[lVar7] ^ bVar10;
          lVar7 = lVar7 + 1;
          bVar14 = lVar7 < lVar9;
          lVar9 = lVar9 + -1;
        } while (bVar14);
      }
    }
  }
  else {
    *s = '0';
    pbVar8 = (byte *)(s + 1);
  }
LAB_0013ebc4:
  *pbVar8 = 0;
  return s;
}

Assistant:

NK_INTERN char*
nk_dtoa(char *s, double n)
{
    int useExp = 0;
    int digit = 0, m = 0, m1 = 0;
    char *c = s;
    int neg = 0;

    NK_ASSERT(s);
    if (!s) return 0;

    if (n == 0.0) {
        s[0] = '0'; s[1] = '\0';
        return s;
    }

    neg = (n < 0);
    if (neg) n = -n;

    /* calculate magnitude */
    m = nk_log10(n);
    useExp = (m >= 14 || (neg && m >= 9) || m <= -9);
    if (neg) *(c++) = '-';

    /* set up for scientific notation */
    if (useExp) {
        if (m < 0)
           m -= 1;
        n = n / (double)nk_pow(10.0, m);
        m1 = m;
        m = 0;
    }
    if (m < 1.0) {
        m = 0;
    }

    /* convert the number */
    while (n > NK_FLOAT_PRECISION || m >= 0) {
        double weight = nk_pow(10.0, m);
        if (weight > 0) {
            double t = (double)n / weight;
            digit = nk_ifloord(t);
            n -= ((double)digit * weight);
            *(c++) = (char)('0' + (char)digit);
        }
        if (m == 0 && n > 0)
            *(c++) = '.';
        m--;
    }

    if (useExp) {
        /* convert the exponent */
        int i, j;
        *(c++) = 'e';
        if (m1 > 0) {
            *(c++) = '+';
        } else {
            *(c++) = '-';
            m1 = -m1;
        }
        m = 0;
        while (m1 > 0) {
            *(c++) = (char)('0' + (char)(m1 % 10));
            m1 /= 10;
            m++;
        }
        c -= m;
        for (i = 0, j = m-1; i<j; i++, j--) {
            /* swap without temporary */
            c[i] ^= c[j];
            c[j] ^= c[i];
            c[i] ^= c[j];
        }
        c += m;
    }
    *(c) = '\0';
    return s;
}